

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptDefaultParameterDeclaration
          (HlslGrammar *this,TType *type,TIntermTyped **node)

{
  HlslToken *loc;
  HlslParseContext *this_00;
  TIntermediate *this_01;
  bool bVar1;
  int iVar2;
  TFunction *function;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  TIntermTyped *pTVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TIntermTyped *pTVar5;
  int i;
  long lVar6;
  TIntermTyped *arguments;
  TIntermTyped *local_38;
  
  *node = (TIntermTyped *)0x0;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
  if (!bVar1) {
    return true;
  }
  bVar1 = acceptConditionalExpression(this,node);
  if (bVar1) {
    pTVar4 = *node;
  }
  else {
    bVar1 = acceptInitializer(this,node);
    if (!bVar1) {
      return false;
    }
    loc = &(this->super_HlslTokenStream).token;
    function = HlslParseContext::makeConstructorCall(this->parseContext,&loc->loc,type);
    if (function == (TFunction *)0x0) {
      return false;
    }
    local_38 = (TIntermTyped *)0x0;
    lVar6 = 0;
    while( true ) {
      iVar2 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[6])();
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 400))
                        ((long *)CONCAT44(extraout_var,iVar2));
      this_00 = this->parseContext;
      pTVar4 = *node;
      if ((int)((ulong)(*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8)) >> 3) <= lVar6) break;
      iVar2 = (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[6])(pTVar4);
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 400))
                        ((long *)CONCAT44(extraout_var_00,iVar2));
      pTVar4 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar3 + 8) + lVar6 * 8) + 0x18))()
      ;
      HlslParseContext::handleFunctionArgument(this_00,function,&local_38,pTVar4);
      lVar6 = lVar6 + 1;
    }
    pTVar4 = HlslParseContext::handleFunctionCall(this_00,&loc->loc,function,pTVar4);
    *node = pTVar4;
  }
  if (pTVar4 == (TIntermTyped *)0x0) {
    return false;
  }
  iVar2 = (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[5])();
  if (CONCAT44(extraout_var_01,iVar2) == 0) {
    pTVar4 = *node;
    this_01 = this->intermediate;
    iVar2 = (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[6])(pTVar4);
    pTVar5 = TIntermediate::fold(this_01,(TIntermAggregate *)CONCAT44(extraout_var_02,iVar2));
    *node = pTVar5;
    if (pTVar5 == (TIntermTyped *)0x0 || pTVar4 == pTVar5) {
      (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
        [0x2d])(this->parseContext,&(this->super_HlslTokenStream).token,
                "invalid default parameter value","","");
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool HlslGrammar::acceptDefaultParameterDeclaration(const TType& type, TIntermTyped*& node)
{
    node = nullptr;

    // Valid not to have a default_parameter_declaration
    if (!acceptTokenClass(EHTokAssign))
        return true;

    if (!acceptConditionalExpression(node)) {
        if (!acceptInitializer(node))
            return false;

        // For initializer lists, we have to const-fold into a constructor for the type, so build
        // that.
        TFunction* constructor = parseContext.makeConstructorCall(token.loc, type);
        if (constructor == nullptr)  // cannot construct
            return false;

        TIntermTyped* arguments = nullptr;
        for (int i = 0; i < int(node->getAsAggregate()->getSequence().size()); i++)
            parseContext.handleFunctionArgument(constructor, arguments, node->getAsAggregate()->getSequence()[i]->getAsTyped());

        node = parseContext.handleFunctionCall(token.loc, constructor, node);
    }

    if (node == nullptr)
        return false;

    // If this is simply a constant, we can use it directly.
    if (node->getAsConstantUnion())
        return true;

    // Otherwise, it has to be const-foldable.
    TIntermTyped* origNode = node;

    node = intermediate.fold(node->getAsAggregate());

    if (node != nullptr && origNode != node)
        return true;

    parseContext.error(token.loc, "invalid default parameter value", "", "");

    return false;
}